

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  _Elt_pointer piVar1;
  int local_c;
  
  Internals::PushDefinitions((this->Internal).x_);
  local_c = 0;
  piVar1 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
              (&(this->LoopBlockCounter).c,&local_c);
  }
  else {
    *piVar1 = 0;
    (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = piVar1 + 1;
  }
  cmFileLockPool::PushFunctionScope(&this->LocalGenerator->GlobalGenerator->FileLockPool);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  this->Internal->PushDefinitions();

  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}